

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseShaderParameter
          (ConversionStream *this,iterator *Token,ShaderParameterInfo *ParamInfo)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  pointer pHVar5;
  Char *pCVar6;
  pointer ppVar7;
  iterator in_RCX;
  String *Args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  String local_5c0;
  undefined1 local_5a0 [8];
  string err_14;
  undefined1 local_578 [8];
  ShaderParameterInfo MemberInfo;
  String local_4d0;
  undefined1 local_4b0 [8];
  string err_13;
  undefined1 local_488 [8];
  string msg;
  HashMapStringKey local_460;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
  local_450;
  iterator it;
  String *StructName;
  _Self local_438;
  iterator DefinedTypeToken;
  string local_410;
  String local_3f0;
  undefined1 local_3c9;
  undefined1 local_3c8 [8];
  string err_12;
  undefined1 local_381;
  undefined1 local_380 [8];
  string err_11;
  String local_358;
  undefined1 local_331;
  undefined1 local_330 [8];
  string err_10;
  String local_308;
  undefined1 local_2e8 [8];
  string err_9;
  undefined1 local_2a8 [8];
  string err_8;
  String local_280;
  undefined1 local_260 [8];
  string err_7;
  undefined1 local_220 [8];
  string err_6;
  anon_class_8_1_017c895b local_1f8;
  _List_node_base *local_1f0;
  String local_1e8;
  undefined1 local_1c8 [8];
  string err_5;
  String local_1a0;
  undefined1 local_180 [8];
  string err_4;
  undefined1 local_140 [8];
  string err_3;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_118;
  iterator TypeToken;
  undefined1 local_f0 [8];
  string err_2;
  undefined1 local_b0 [8];
  string err_1;
  const_iterator local_88;
  _List_node_base *local_80;
  String local_68;
  undefined1 local_48 [8];
  string err;
  ShaderParameterInfo *ParamInfo_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar2 = std::operator!=(Token,(_Self *)((long)&err.field_2 + 8));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    FormatString<char[43]>
              ((string *)local_48,(char (*) [43])"Unexpected EOF while parsing argument list");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_68,this,Token,4)
    ;
    in_RCX._M_node = (_List_node_base *)0x926;
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x926,in_R8,(char (*) [2])0x46b1a3,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)local_48);
  }
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar2 = ShaderParameterInfo::SetInterpolationQualifier(ParamInfo,pHVar5->Type);
  if (bVar2) {
    std::_List_const_iterator<Diligent::Parsing::HLSLTokenInfo>::_List_const_iterator
              (&local_88,Token);
    in_RCX = std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::erase(&this->m_Tokens,local_88);
    Token->_M_node = (_List_node_base *)in_RCX;
    local_80 = in_RCX._M_node;
    err_1.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(Token,(_Self *)((long)&err_1.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      FormatString<char[43]>
                ((string *)local_b0,(char (*) [43])"Unexpected EOF while parsing argument list");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)((long)&err_2.field_2 + 8),this,Token,4);
      in_RCX._M_node = (_List_node_base *)0x92f;
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x92f,in_R8,(char (*) [2])0x46b1a3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_2.field_2 + 8));
      std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_b0);
    }
  }
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  bVar2 = Parsing::HLSLTokenInfo::IsBuiltInType(pHVar5);
  if ((!bVar2) &&
     (pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token),
     pHVar5->Type != Identifier)) {
    FormatString<char[22]>((string *)local_f0,(char (*) [22])"Missing argument type");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)&TypeToken,this,Token,4);
    in_RCX._M_node = (_List_node_base *)0x933;
    in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x933,in_R8,(char (*) [2])0x46b1a3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&TypeToken);
    std::__cxx11::string::~string((string *)&TypeToken);
    std::__cxx11::string::~string((string *)local_f0);
  }
  local_118._M_node = Token->_M_node;
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  std::__cxx11::string::operator=((string *)&ParamInfo->Type,(string *)&pHVar5->Literal);
  if (ParamInfo->storageQualifier != Ret) {
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    err_3.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(Token,(_Self *)((long)&err_3.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      FormatString<char[43]>
                ((string *)local_140,(char (*) [43])"Unexpected EOF while parsing argument list");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                ((String *)((long)&err_4.field_2 + 8),this,Token,4);
      in_RCX._M_node = (_List_node_base *)0x93c;
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x93c,in_R8,(char (*) [2])0x46b1a3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_4.field_2 + 8));
      std::__cxx11::string::~string((string *)(err_4.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_140);
    }
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar5->Type != Identifier) {
      FormatString<char[29],std::__cxx11::string>
                ((string *)local_180,(Diligent *)"Missing argument name after ",
                 (char (*) [29])&ParamInfo->Type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX._M_node
                );
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_1a0,this,Token,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x93d,in_R8,(char (*) [2])0x46b1a3,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)local_180);
    }
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    std::__cxx11::string::operator=((string *)&ParamInfo->Name,(string *)&pHVar5->Literal);
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
    err_5.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar2 = std::operator!=(Token,(_Self *)((long)&err_5.field_2 + 8));
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      FormatString<char[15]>((string *)local_1c8,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_1e8,this,Token,4);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x941,in_R8,(char (*) [2])0x46b1a3,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)local_1c8);
    }
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
    if (pHVar5->Type == OpenSquareBracket) {
      local_1f0 = (_List_node_base *)
                  std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::end(&this->m_Tokens);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x138;
      local_1f8.ParamInfo = ParamInfo;
      ProcessScope<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ParseShaderParameter(std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>&,Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo&)::__0>
                (this,Token,(iterator)local_1f0,OpenSquareBracket,ClosingSquareBracket,&local_1f8);
      err_6.field_2._8_8_ =
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar2 = std::operator!=(Token,(_Self *)((long)&err_6.field_2 + 8));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        FormatString<char[15]>((string *)local_220,(char (*) [15])"Unexpected EOF");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)((long)&err_7.field_2 + 8),this,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x94f,in_R8,(char (*) [2])0x46b1a3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err_7.field_2 + 8));
        std::__cxx11::string::~string((string *)(err_7.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_220);
      }
      pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if (pHVar5->Type != ClosingSquareBracket) {
        FormatString<char[24]>((string *)local_260,(char (*) [24])"Closing staple expected");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_280,this,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x952,in_R8,(char (*) [2])0x46b1a3,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::__cxx11::string::~string((string *)local_260);
      }
      std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
      err_8.field_2._8_8_ =
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar2 = std::operator!=(Token,(_Self *)((long)&err_8.field_2 + 8));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        FormatString<char[15]>((string *)local_2a8,(char (*) [15])"Unexpected EOF");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  ((String *)((long)&err_9.field_2 + 8),this,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x955,in_R8,(char (*) [2])0x46b1a3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&err_9.field_2 + 8));
        std::__cxx11::string::~string((string *)(err_9.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_2a8);
      }
      pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      if (pHVar5->Type == OpenSquareBracket) {
        FormatString<char[43]>
                  ((string *)local_2e8,(char (*) [43])"Multi-dimensional arrays are not supported");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_308,this,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x956,in_R8,(char (*) [2])0x46b1a3,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)local_2e8);
      }
    }
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
    bVar2 = Parsing::HLSLTokenInfo::IsBuiltInType(pHVar5);
    if (bVar2) {
      err_10.field_2._8_8_ =
           std::__cxx11::
           list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
           ::end(&this->m_Tokens);
      bVar2 = std::operator!=(Token,(_Self *)((long)&err_10.field_2 + 8));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_331 = (_Alloc_hider)0x22;
        FormatString<char[40],std::__cxx11::string,char>
                  ((string *)local_330,(Diligent *)"Unexpected end of file after argument \"",
                   (char (*) [40])&ParamInfo->Name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_331,
                   (char *)in_R8);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_358,this,Token,4);
        in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ParseShaderParameter",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x95d,in_R8,(char (*) [2])0x46b1a3,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)local_330);
      }
      pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
      bVar2 = std::operator==(&pHVar5->Literal,":");
      if (bVar2) {
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
        err_11.field_2._8_8_ =
             std::__cxx11::
             list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ::end(&this->m_Tokens);
        bVar2 = std::operator!=(Token,(_Self *)((long)&err_11.field_2 + 8));
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          local_381 = (_Alloc_hider)0x22;
          FormatString<char[65],std::__cxx11::string,char>
                    ((string *)local_380,
                     (Diligent *)"Unexpected end of file while looking for semantic for argument \""
                     ,(char (*) [65])&ParamInfo->Name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_381
                     ,(char *)in_R8);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((String *)((long)&err_12.field_2 + 8),this,Token,4);
          in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseShaderParameter",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x963,in_R8,(char (*) [2])0x46b1a3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&err_12.field_2 + 8));
          std::__cxx11::string::~string((string *)(err_12.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_380);
        }
        pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        if (pHVar5->Type != Identifier) {
          local_3c9 = (_Alloc_hider)0x22;
          FormatString<char[32],std::__cxx11::string,char>
                    ((string *)local_3c8,(Diligent *)"Missing semantic for argument \"",
                     (char (*) [32])&ParamInfo->Name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3c9
                     ,(char *)in_R8);
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_3f0,this,Token,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ParseShaderParameter",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x964,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_3c8,(char (*) [2])0x46b1a3,&local_3f0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)local_3c8);
        }
        pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
        std::__cxx11::string::string((string *)&DefinedTypeToken,(string *)&pHVar5->Literal);
        StrToLower(&local_410,(string *)&DefinedTypeToken);
        std::__cxx11::string::operator=((string *)&ParamInfo->Semantic,(string *)&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&DefinedTypeToken);
        std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
      }
    }
  }
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
  bVar2 = Parsing::HLSLTokenInfo::IsBuiltInType(pHVar5);
  if (bVar2) {
    return;
  }
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
  local_438._M_node = (_List_node_base *)FindMacroDefinition(this,&pHVar5->Literal);
  StructName = (String *)
               std::__cxx11::
               list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
               ::end(&this->m_Tokens);
  bVar3 = std::operator!=(&local_438,(_Self *)&StructName);
  bVar2 = false;
  if (bVar3) {
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_438);
    uVar1 = pHVar5->Idx;
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
    bVar2 = uVar1 < pHVar5->Idx;
  }
  if (bVar2) {
    local_118._M_node = local_438._M_node;
  }
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
  Args_1 = &pHVar5->Literal;
  it.
  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
             )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
               )Args_1;
  pCVar6 = (Char *)std::__cxx11::string::c_str();
  HashMapStringKey::HashMapStringKey(&local_460,pCVar6,false);
  local_450._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
       ::find(&this->m_StructDefinitions,&local_460);
  HashMapStringKey::~HashMapStringKey(&local_460);
  msg.field_2._8_8_ =
       std::
       unordered_map<Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>_>
       ::end(&this->m_StructDefinitions);
  bVar2 = std::__detail::operator==
                    (&local_450,
                     (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
                      *)((long)&msg.field_2 + 8));
  if (bVar2) {
    Args_1 = (String *)0x97c;
    LogError<true,char[37],std::__cxx11::string,char[2]>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x97c,(char (*) [37])"Unable to find definition for type \'",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               it.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
               ._M_cur,(char (*) [2])0x4588e8);
  }
  ppVar7 = std::__detail::
           _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false,_false>
                         *)&local_450);
  local_118._M_node = (ppVar7->second)._M_node;
  pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
  if (pHVar5->Type == Identifier) {
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
    _Var4 = std::operator==(&pHVar5->Literal,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            it.
                            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_false>
                            ._M_cur);
    if (_Var4) goto LAB_0029db1b;
  }
  FormatString<char[26],char[77]>
            ((string *)local_488,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])
             "TypeToken->Type == TokenType::Identifier && TypeToken->Literal == StructName",
             (char (*) [77])Args_1);
  pCVar6 = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (pCVar6,"ParseShaderParameter",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x981);
  std::__cxx11::string::~string((string *)local_488);
LAB_0029db1b:
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_118);
  err_13.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar3 = std::operator!=(&local_118,(_Self *)((long)&err_13.field_2 + 8));
  bVar2 = false;
  if (bVar3) {
    pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
    bVar2 = pHVar5->Type == OpenBrace;
  }
  if (!bVar2) {
    FormatString<char[20]>((string *)local_4b0,(char (*) [20])"Open brace expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_4d0,this,&local_118,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ParseShaderParameter",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x987,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0
               ,(char (*) [2])0x46b1a3,&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)local_4b0);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_118);
  while( true ) {
    MemberInfo.members.
    super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__cxx11::
                  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                  ::end(&this->m_Tokens);
    bVar3 = std::operator!=(&local_118,
                            (_Self *)&MemberInfo.members.
                                      super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = false;
    if (bVar3) {
      pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
      bVar2 = pHVar5->Type != ClosingBrace;
    }
    if (!bVar2) break;
    ShaderParameterInfo::ShaderParameterInfo((ShaderParameterInfo *)local_578);
    ParseShaderParameter(this,&local_118,(ShaderParameterInfo *)local_578);
    local_578[0] = ParamInfo->storageQualifier;
    std::
    vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
    ::emplace_back<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>
              (&ParamInfo->members,(ShaderParameterInfo *)local_578);
    err_14.field_2._8_8_ =
         std::__cxx11::
         list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
         end(&this->m_Tokens);
    bVar3 = std::operator!=(Token,(_Self *)((long)&err_14.field_2 + 8));
    bVar2 = false;
    if (bVar3) {
      pHVar5 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(&local_118);
      bVar2 = pHVar5->Type == Semicolon;
    }
    if (!bVar2) {
      FormatString<char[19]>((string *)local_5a0,(char (*) [19])"Semicolon expected");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_5c0,this,&local_118,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ParseShaderParameter",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x99b,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_5a0,(char (*) [2])0x46b1a3,&local_5c0);
      std::__cxx11::string::~string((string *)&local_5c0);
      std::__cxx11::string::~string((string *)local_5a0);
    }
    std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(&local_118);
    ShaderParameterInfo::~ShaderParameterInfo((ShaderParameterInfo *)local_578);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ParseShaderParameter(TokenListType::iterator& Token, ShaderParameterInfo& ParamInfo)
{
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");

    if (ParamInfo.SetInterpolationQualifier(Token->Type))
    {
        //          out noperspective float4 Color : SV_Target,
        //              ^
        Token = m_Tokens.erase(Token);
        //          out float4 Color : SV_Target,
        //              ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");
    }

    VERIFY_PARSER_STATE(Token, Token->IsBuiltInType() || Token->Type == TokenType::Identifier,
                        "Missing argument type");
    auto TypeToken = Token;
    ParamInfo.Type = Token->Literal;

    if (ParamInfo.storageQualifier != ShaderParameterInfo::StorageQualifier::Ret)
    {
        ++Token;
        //          out float4 Color : SV_Target,
        //                     ^
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while parsing argument list");
        VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing argument name after ", ParamInfo.Type);
        ParamInfo.Name = Token->Literal;

        ++Token;
        VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");

        if (Token->Type == TokenType::OpenSquareBracket)
        {
            // triangle VSOut In[3]
            //                  ^
            ProcessScope(
                Token, m_Tokens.end(), TokenType::OpenSquareBracket, TokenType::ClosingSquareBracket,
                [&](TokenListType::iterator& tkn, int) {
                    ParamInfo.ArraySize.append(tkn->Delimiter);
                    ParamInfo.ArraySize.append(tkn->Literal);
                    ++tkn;
                } //
            );
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            // triangle VSOut In[3],
            //                    ^
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::ClosingSquareBracket, "Closing staple expected");

            ++Token;
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Type != TokenType::OpenSquareBracket, "Multi-dimensional arrays are not supported");
        }

        if (TypeToken->IsBuiltInType())
        {
            //          out float4 Color : SV_Target,
            //                           ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file after argument \"", ParamInfo.Name, '\"');
            if (Token->Literal == ":")
            {
                ++Token;
                //          out float4 Color : SV_Target,
                //                             ^
                VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected end of file while looking for semantic for argument \"", ParamInfo.Name, '\"');
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Missing semantic for argument \"", ParamInfo.Name, '\"');
                // Transform to lower case -  semantics are case-insensitive
                ParamInfo.Semantic = StrToLower(Token->Literal);

                ++Token;
                //          out float4 Color : SV_Target,
                //                                      ^
            }
        }
    }

    if (!TypeToken->IsBuiltInType())
    {
        {
            auto DefinedTypeToken = FindMacroDefinition(TypeToken->Literal);
            // Check that the define directive is before the type token
            if (DefinedTypeToken != m_Tokens.end() && DefinedTypeToken->Idx < TypeToken->Idx)
            {
                TypeToken = DefinedTypeToken;
            }
        }
        const auto& StructName = TypeToken->Literal;
        auto        it         = m_StructDefinitions.find(StructName.c_str());
        if (it == m_StructDefinitions.end())
            LOG_ERROR_AND_THROW("Unable to find definition for type \'", StructName, "\'");

        TypeToken = it->second;
        // struct VSOutput
        //        ^
        VERIFY_EXPR(TypeToken->Type == TokenType::Identifier && TypeToken->Literal == StructName);

        ++TypeToken;
        // struct VSOutput
        // {
        // ^
        VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.end() && TypeToken->Type == TokenType::OpenBrace, "Open brace expected");

        ++TypeToken;
        // struct VSOutput
        // {
        //     float4 f4Position;
        //     ^
        while (TypeToken != m_Tokens.end() && TypeToken->Type != TokenType::ClosingBrace)
        {
            ShaderParameterInfo MemberInfo;
            ParseShaderParameter(TypeToken, MemberInfo);
            // Set storage qualifier after we process the member as otherwise
            // members of a struct with the StorageQualifier::Ret qualifier
            // will not be processed.
            MemberInfo.storageQualifier = ParamInfo.storageQualifier;
            ParamInfo.members.emplace_back(std::move(MemberInfo));
            // struct VSOutput
            // {
            //     float4 f4Position;
            //                      ^
            VERIFY_PARSER_STATE(TypeToken, Token != m_Tokens.end() && TypeToken->Type == TokenType::Semicolon, "Semicolon expected");
            ++TypeToken;
        }
    }
}